

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O2

void Omega_h::transfer_length
               (Mesh *old_mesh,Mesh *new_mesh,LOs *same_ents2old_ents,LOs *same_ents2new_ents,
               LOs *prods2new_ents)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  TagBase *this;
  string *__lhs;
  int i;
  Write<double> local_90;
  Write<int> local_80;
  Reals prod_data;
  Write<int> local_60;
  Write<int> local_50;
  Write<int> local_40;
  
  i = 0;
  while( true ) {
    IVar2 = Mesh::ntags(old_mesh,1);
    if (IVar2 <= i) break;
    this = Mesh::get_tag(old_mesh,1,i);
    __lhs = TagBase::name_abi_cxx11_(this);
    bVar1 = std::operator==(__lhs,"length");
    if (bVar1) {
      iVar3 = (*this->_vptr_TagBase[2])(this);
      if (iVar3 == 5) {
        IVar2 = TagBase::ncomps(this);
        if (IVar2 == 1) {
          Write<int>::Write(&local_40,&prods2new_ents->write_);
          measure_edges_metric((Omega_h *)&prod_data,new_mesh,(LOs *)&local_40);
          Write<int>::~Write(&local_40);
          Write<int>::Write(&local_50,&same_ents2old_ents->write_);
          Write<int>::Write(&local_60,&same_ents2new_ents->write_);
          Write<int>::Write(&local_80,&prods2new_ents->write_);
          Write<double>::Write(&local_90,&prod_data.write_);
          transfer_common<double>
                    (old_mesh,new_mesh,1,(LOs *)&local_50,(LOs *)&local_60,(LOs *)&local_80,this,
                     (Read<double> *)&local_90);
          Write<double>::~Write(&local_90);
          Write<int>::~Write(&local_80);
          Write<int>::~Write(&local_60);
          Write<int>::~Write(&local_50);
          Write<double>::~Write(&prod_data.write_);
        }
      }
    }
    i = i + 1;
  }
  return;
}

Assistant:

void transfer_length(Mesh* old_mesh, Mesh* new_mesh, LOs same_ents2old_ents,
    LOs same_ents2new_ents, LOs prods2new_ents) {
  for (Int i = 0; i < old_mesh->ntags(EDGE); ++i) {
    auto tagbase = old_mesh->get_tag(EDGE, i);
    if (tagbase->name() == "length" && tagbase->type() == OMEGA_H_REAL &&
        tagbase->ncomps() == 1) {
      auto prod_data = measure_edges_metric(new_mesh, prods2new_ents);
      transfer_common(old_mesh, new_mesh, EDGE, same_ents2old_ents,
          same_ents2new_ents, prods2new_ents, tagbase, prod_data);
    }
  }
}